

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::emplace<QPropertyAnimation*const&>
          (QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *this,
          pair<QObject_*,_QByteArray> *key,QPropertyAnimation **args)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> copy;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *in_stack_ffffffffffffff78;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *in_stack_ffffffffffffff80;
  QPropertyAnimation **in_stack_ffffffffffffff88;
  pair<QObject_*,_QByteArray> *in_stack_ffffffffffffff90;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *in_stack_ffffffffffffff98;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::isDetached
                    (in_stack_ffffffffffffff80);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::
            shouldGrow((Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                        *)*in_RDI);
    if (bVar2) {
      local_28 = (undefined1  [16])
                 emplace_helper<QPropertyAnimation*>
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88);
    }
    else {
      local_28 = (undefined1  [16])
                 emplace_helper<QPropertyAnimation*const&>
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88);
    }
  }
  else {
    QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::QHash
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::detach(in_stack_ffffffffffffff80)
    ;
    local_28 = (undefined1  [16])
               emplace_helper<QPropertyAnimation*const&>
                         (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
    QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::~QHash(in_stack_ffffffffffffff80)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *
                )local_28._0_8_;
    iVar3.i.bucket = local_28._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }